

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

void cfd::CoinSelection::ConvertToUtxo
               (uint64_t block_height,BlockHash *block_hash,Txid *txid,uint32_t vout,
               Script *locking_script,string *output_descriptor,Amount *amount,void *binary_data,
               Utxo *utxo,Script *scriptsig_template)

{
  CfdException *this;
  undefined1 local_558 [608];
  int64_t local_2f8;
  bool local_2f0;
  AddressType local_2e8;
  void *local_2e0;
  Script local_68;
  
  if (utxo != (Utxo *)0x0) {
    memset(utxo,0,0xd8);
    UtxoData::UtxoData((UtxoData *)local_558);
    local_558._0_8_ = block_height;
    core::BlockHash::operator=((BlockHash *)(local_558 + 8),block_hash);
    core::Txid::operator=((Txid *)(local_558 + 0x28),txid);
    local_558._72_4_ = vout;
    core::Script::operator=((Script *)(local_558 + 0x50),locking_script);
    std::__cxx11::string::_M_assign((string *)(local_558 + 0x240));
    local_2f0 = amount->ignore_check_;
    local_2f8 = amount->amount_;
    local_2e8 = kP2wpkhAddress;
    if (scriptsig_template != (Script *)0x0) {
      core::Script::operator=(&local_68,scriptsig_template);
    }
    local_2e0 = binary_data;
    UtxoUtil::ConvertToUtxo((UtxoData *)local_558,utxo,(UtxoData *)0x0);
    UtxoData::~UtxoData((UtxoData *)local_558);
    return;
  }
  local_558._0_8_ = "cfd_utxo.cpp";
  local_558._8_4_ = 0x3c9;
  local_558._16_8_ = "ConvertToUtxo";
  core::logger::log<>((CfdSourceLocation *)local_558,kCfdLogLevelWarning,"utxo is nullptr.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_558._0_8_ = local_558 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"Failed to convert utxo. utxo is nullptr.","");
  core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_558);
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CoinSelection::ConvertToUtxo(
    uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
    uint32_t vout, const Script& locking_script,
    const std::string& output_descriptor, const Amount& amount,
    const void* binary_data, Utxo* utxo, const Script* scriptsig_template) {
  if (utxo == nullptr) {
    warn(CFD_LOG_SOURCE, "utxo is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to convert utxo. utxo is nullptr.");
  }
  memset(utxo, 0, sizeof(*utxo));

  UtxoData utxo_data;
  utxo_data.block_height = block_height;
  utxo_data.block_hash = block_hash;
  utxo_data.txid = txid;
  utxo_data.vout = vout;
  utxo_data.locking_script = locking_script;
  utxo_data.descriptor = output_descriptor;
  utxo_data.amount = amount;
  utxo_data.address_type = AddressType::kP2wpkhAddress;  // initialize
  if (scriptsig_template != nullptr) {
    utxo_data.scriptsig_template = *scriptsig_template;
  }
  memcpy(&utxo_data.binary_data, &binary_data, sizeof(void*));
  UtxoUtil::ConvertToUtxo(utxo_data, utxo, nullptr);
}